

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

void cf_h1_proxy_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  h1_tunnel_state_conflict *ts_00;
  _Bool _Var1;
  curl_socket_t sock_00;
  curl_socket_t sock;
  h1_tunnel_state_conflict *ts;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  ts_00 = (h1_tunnel_state_conflict *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    sock_00 = Curl_conn_cf_get_socket(cf,data);
    if (ts_00 == (h1_tunnel_state_conflict *)0x0) {
      Curl_pollset_change(data,ps,sock_00,2,1);
    }
    else {
      _Var1 = tunnel_want_send(ts_00);
      if (_Var1) {
        Curl_pollset_change(data,ps,sock_00,2,1);
      }
      else {
        Curl_pollset_change(data,ps,sock_00,1,2);
      }
    }
  }
  return;
}

Assistant:

static void cf_h1_proxy_adjust_pollset(struct Curl_cfilter *cf,
                                        struct Curl_easy *data,
                                        struct easy_pollset *ps)
{
  struct h1_tunnel_state *ts = cf->ctx;

  if(!cf->connected) {
    /* If we are not connected, but the filter "below" is
     * and not waiting on something, we are tunneling. */
    curl_socket_t sock = Curl_conn_cf_get_socket(cf, data);
    if(ts) {
      /* when we have sent a CONNECT to a proxy, we should rather either
         wait for the socket to become readable to be able to get the
         response headers or if we are still sending the request, wait
         for write. */
      if(tunnel_want_send(ts))
        Curl_pollset_set_out_only(data, ps, sock);
      else
        Curl_pollset_set_in_only(data, ps, sock);
    }
    else
      Curl_pollset_set_out_only(data, ps, sock);
  }
}